

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTextUsage.cpp
# Opt level: O3

EStatusCode RunTrueTypeTest(char **argv,bool inEmbedFonts)

{
  pointer pcVar1;
  EStatusCode EVar2;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *inFontReference;
  int iVar4;
  undefined7 in_register_00000031;
  char *pcVar5;
  char *pcVar6;
  PDFWriter pdfWriter;
  string local_1040;
  undefined1 local_1020 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1008;
  undefined1 local_ff0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fd0;
  _Alloc_hider local_fb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fa8;
  string local_f90;
  string local_f70;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  iVar4 = (int)CONCAT71(in_register_00000031,inEmbedFonts);
  pcVar5 = "SimpleTextUsageTrueTypeNoEmbed.pdf";
  if (iVar4 != 0) {
    pcVar5 = "SimpleTextUsageTrueType.pdf";
  }
  pcVar6 = pcVar5 + 0x22;
  if (iVar4 != 0) {
    pcVar6 = pcVar5 + 0x1b;
  }
  PDFWriter::PDFWriter(&local_ee0);
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,pcVar5,pcVar6);
  BuildRelativeOutputPath(&local_f50,(char **)argv[2],&local_f90);
  local_1040._M_dataplus._M_p = (pointer)&local_1040.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1040,"SimpleTextUsage.log","");
  BuildRelativeOutputPath(&local_f70,(char **)argv[2],&local_1040);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1020,true,true,&local_f70);
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar3->ShouldEncrypt;
  pcVar1 = (pEVar3->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar1,pcVar1 + (pEVar3->UserPassword)._M_string_length);
  local_f08 = pEVar3->UserProtectionOptionsFlag;
  pcVar1 = (pEVar3->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar1,pcVar1 + (pEVar3->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_ff0,true,inEmbedFonts,(EncryptionOptions *)local_f30,false
            );
  EVar2 = PDFWriter::StartPDF(&local_ee0,&local_f50,ePDFVersion13,(LogConfiguration *)local_1020,
                              (PDFCreationSettings *)local_ff0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb8._M_p != &local_fa8) {
    operator_delete(local_fb8._M_p,local_fa8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._16_8_ != &local_fd0) {
    operator_delete((void *)local_ff0._16_8_,local_fd0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1020._8_8_ != &local_1008) {
    operator_delete((void *)local_1020._8_8_,local_1008._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1040._M_dataplus._M_p != &local_1040.field_2) {
    operator_delete(local_1040._M_dataplus._M_p,local_1040.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p,local_f90.field_2._M_allocated_capacity + 1);
  }
  if (EVar2 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_ff0,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)local_ff0);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_ff0);
    inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
    if (inPageContext == (PageContentContext *)0x0) {
      EVar2 = eFailure;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"failed to create content context for page\n",0x2a);
    }
    else {
      local_1020._0_8_ = local_1020 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1020,"fonts/arial.ttf","");
      BuildRelativeInputPath((string *)local_ff0,(char **)argv[1],(string *)local_1020);
      inFontReference = PDFWriter::GetFontForFile(&local_ee0,(string *)local_ff0,0);
      pcVar1 = local_ff0 + 0x10;
      if ((pointer)local_ff0._0_8_ != pcVar1) {
        operator_delete((void *)local_ff0._0_8_,(ulong)(local_ff0._16_8_ + 1));
      }
      if ((undefined1 *)local_1020._0_8_ != local_1020 + 0x10) {
        operator_delete((void *)local_1020._0_8_,local_1020._16_8_ + 1);
      }
      if (inFontReference == (PDFUsedFont *)0x0) {
        EVar2 = eFailure;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Failed to create font object for arial.ttf\n",0x2b);
      }
      else {
        AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
        AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
        AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,inFontReference,1.0)
        ;
        AbstractContentContext::Tm
                  (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
        local_ff0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_ff0,"hello world","");
        EVar2 = AbstractContentContext::Tj
                          (&inPageContext->super_AbstractContentContext,(string *)local_ff0);
        if ((pointer)local_ff0._0_8_ != pcVar1) {
          operator_delete((void *)local_ff0._0_8_,(ulong)(local_ff0._16_8_ + 1));
        }
        if (EVar2 != eSuccess) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Could not find some of the glyphs for this font",0x2f);
        }
        AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
        EVar2 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
        if (EVar2 == eSuccess) {
          EVar2 = PDFWriter::WritePageAndRelease(&local_ee0,this);
          if (EVar2 == eSuccess) {
            EVar2 = PDFWriter::EndPDF(&local_ee0);
            if (EVar2 == eSuccess) {
              EVar2 = eSuccess;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"failed in end PDF\n",0x12);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"failed to write page\n",0x15);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"failed to end page content context\n",0x23);
        }
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start PDF\n",0x14);
  }
  PDFWriter::~PDFWriter(&local_ee0);
  return EVar2;
}

Assistant:

static EStatusCode RunTrueTypeTest(char* argv[],bool inEmbedFonts)
{
	PDFWriter pdfWriter;
	EStatusCode status; 

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv, inEmbedFonts ? "SimpleTextUsageTrueType.pdf" : "SimpleTextUsageTrueTypeNoEmbed.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,BuildRelativeOutputPath(argv,"SimpleTextUsage.log")),
									PDFCreationSettings(true,inEmbedFonts));
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if(NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout<<"failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
                                BuildRelativeInputPath(argv,"fonts/arial.ttf"));
		if(!font)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font object for arial.ttf\n";
			break;
		}


		// Draw some text
		contentContext->BT();
		contentContext->k(0,0,0,1);

		contentContext->Tf(font,1);

		contentContext->Tm(30,0,0,30,78.4252,662.8997);

		EStatusCode encodingStatus = contentContext->Tj("hello world");
		if(encodingStatus != PDFHummus::eSuccess)
			cout<<"Could not find some of the glyphs for this font";

		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}
	}while(false);
	return status;	
}